

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filteredbrk.cpp
# Opt level: O0

int32_t __thiscall
icu_63::SimpleFilteredSentenceBreakIterator::internalPrev
          (SimpleFilteredSentenceBreakIterator *this,int32_t n)

{
  UBool UVar1;
  EFBMatchResult EVar2;
  BreakIterator *pBVar3;
  UErrorCode local_20;
  EFBMatchResult m;
  UErrorCode status;
  int32_t n_local;
  SimpleFilteredSentenceBreakIterator *this_local;
  
  m = n;
  if (((n == 0) || (n == -1)) ||
     (_status = this,
     UVar1 = LocalPointerBase<icu_63::UCharsTrie>::isNull
                       (&(this->fData->fBackwardsTrie).super_LocalPointerBase<icu_63::UCharsTrie>),
     UVar1 != '\0')) {
    this_local._4_4_ = m;
  }
  else {
    local_20 = U_ZERO_ERROR;
    resetState(this,&local_20);
    UVar1 = ::U_FAILURE(local_20);
    if (UVar1 == '\0') {
      while (m != ~kNoExceptionHere && m != kNoExceptionHere) {
        EVar2 = breakExceptionAt(this,m);
        if ((EVar2 == kNoExceptionHere) || (EVar2 != kExceptionHere)) {
          return m;
        }
        pBVar3 = LocalPointerBase<icu_63::BreakIterator>::operator->
                           (&(this->fDelegate).super_LocalPointerBase<icu_63::BreakIterator>);
        m = (*(pBVar3->super_UObject)._vptr_UObject[0xc])();
      }
      this_local._4_4_ = m;
    }
    else {
      this_local._4_4_ = ~kNoExceptionHere;
    }
  }
  return this_local._4_4_;
}

Assistant:

int32_t
SimpleFilteredSentenceBreakIterator::internalPrev(int32_t n) {
  if(n == 0 || n == UBRK_DONE || // at end  or
    fData->fBackwardsTrie.isNull()) { // .. no backwards table loaded == no exceptions
      return n;
  }
  // OK, do we need to break here?
  UErrorCode status = U_ZERO_ERROR;
  // refresh text
  resetState(status);
  if(U_FAILURE(status)) return UBRK_DONE; // bail out

  //if(debug2) u_printf("str, native len=%d\n", utext_nativeLength(fText.getAlias()));
  while (n != UBRK_DONE && n != 0) { // outer loop runs once per underlying break (from fDelegate).
    SimpleFilteredSentenceBreakIterator::EFBMatchResult m = breakExceptionAt(n);

    switch(m) {
    case kExceptionHere:
      n = fDelegate->previous(); // skip this one. Find the next lowerlevel break.
      continue;

    default:
    case kNoExceptionHere:
      return n;
    }    
  }
  return n;
}